

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshortcut_p.h
# Opt level: O1

void __thiscall QShortcutPrivate::~QShortcutPrivate(QShortcutPrivate *this)

{
  int *piVar1;
  
  *(code **)this = QHoverEvent::QHoverEvent;
  piVar1 = *(int **)(this + 0xb0);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0xb0),4,0x10);
    }
  }
  piVar1 = *(int **)(this + 0x90);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0x90),2,0x10);
    }
  }
  QArrayDataPointer<QKeySequence>::~QArrayDataPointer
            ((QArrayDataPointer<QKeySequence> *)(this + 0x78));
  QObjectPrivate::~QObjectPrivate((QObjectPrivate *)this);
  return;
}

Assistant:

class Q_GUI_EXPORT QShortcutPrivate : public QObjectPrivate
{
    Q_DECLARE_PUBLIC(QShortcut)
public:
    QShortcutPrivate() = default;

    virtual QShortcutMap::ContextMatcher contextMatcher() const;
    virtual bool handleWhatsThis() { return false; }

    static bool simpleContextMatcher(QObject *object, Qt::ShortcutContext context);

    QList<QKeySequence> sc_sequences;
    QString sc_whatsthis;
    Qt::ShortcutContext sc_context = Qt::WindowShortcut;
    bool sc_enabled = true;
    bool sc_autorepeat = true;
    QList<int> sc_ids;
    void redoGrab(QShortcutMap &map);
}